

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Gym_Emu::load_mem_(Gym_Emu *this,byte_ *in,long size)

{
  long in_RDX;
  byte_ *in_RSI;
  Music_Emu *in_RDI;
  blargg_err_t blargg_return_err_;
  int offset;
  int local_24;
  long local_20;
  byte_ *local_18;
  blargg_err_t local_8;
  
  local_24 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_8 = check_header(in_RSI,in_RDX,&local_24);
  if (local_8 == (blargg_err_t)0x0) {
    Music_Emu::set_voice_count(in_RDI,8);
    in_RDI[3].super_Gme_File.playlist.entries.begin_ = (entry_t *)(local_18 + local_24);
    in_RDI[3].super_Gme_File.playlist.data.size_ = (size_t)(local_18 + local_20);
    in_RDI[3].super_Gme_File.playlist.entries.size_ = 0;
    if (local_24 == 0) {
      memset(&in_RDI[3].super_Gme_File.playlist.field_0x24,0,0x1ac);
    }
    else {
      memcpy(&in_RDI[3].super_Gme_File.playlist.field_0x24,local_18,0x1ac);
    }
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t Gym_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,packed [4]) == header_size );
	int offset = 0;
	RETURN_ERR( check_header( in, size, &offset ) );
	set_voice_count( 8 );
	
	data     = in + offset;
	data_end = in + size;
	loop_begin = 0;
	
	if ( offset )
		header_ = *(header_t const*) in;
	else
		memset( &header_, 0, sizeof header_ );
	
	return 0;
}